

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t uVar4;
  CompilerError *pCVar5;
  SPIRType *pSVar6;
  char (*ts_2) [2];
  char (*in_stack_fffffffffffff898) [2];
  bool local_6f9;
  bool local_6f2;
  byte local_6ca;
  string local_650;
  string local_630;
  undefined1 local_609;
  char *local_608;
  char *overlapping_binding_tag;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  undefined1 local_580 [8];
  SPIRType orig_type;
  string decl_type;
  SPIRType *data_type;
  bool local_3e5;
  BuiltIn local_3e4;
  undefined1 local_3e0 [3];
  bool is_ib_in_out;
  BuiltIn builtin;
  string array_type;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  allocator local_231;
  undefined1 local_230 [8];
  string td_line;
  undefined1 local_208 [8];
  string base_type;
  uint local_1e0;
  uint32_t cols;
  uint32_t rows;
  SPIRType *declared_type;
  SPIRType row_major_physical_type;
  bool local_75;
  bool row_major;
  uint32_t local_64;
  undefined1 local_60 [4];
  uint32_t orig_id;
  string pack_pfx;
  SPIRType *physical_type;
  uint32_t orig_member_type_id;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *result;
  
  bVar2 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  qualifier_local._4_4_ = member_type_id;
  if (bVar2) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    qualifier_local._4_4_ =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,uVar3,index,SPIRVCrossDecorationPhysicalTypeID);
  }
  pack_pfx.field_2._8_8_ =
       Compiler::get<spirv_cross::SPIRType>((Compiler *)this,qualifier_local._4_4_);
  ::std::__cxx11::string::string((string *)local_60);
  local_64 = 0;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  bVar2 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,uVar3,index,SPIRVCrossDecorationInterfaceOrigID);
  if (bVar2) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    local_64 = Compiler::get_extended_member_decoration
                         ((Compiler *)this,uVar3,index,SPIRVCrossDecorationInterfaceOrigID);
  }
  local_75 = false;
  bVar2 = Compiler::is_matrix((Compiler *)this,(SPIRType *)pack_pfx.field_2._8_8_);
  if (bVar2) {
    row_major_physical_type.member_name_cache._M_h._M_single_bucket._4_4_ =
         TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
    local_75 = Compiler::has_member_decoration
                         ((Compiler *)this,
                          (TypeID)row_major_physical_type.member_name_cache._M_h._M_single_bucket.
                                  _4_4_,index,DecorationRowMajor);
  }
  SPIRType::SPIRType((SPIRType *)&declared_type,OpTypeMatrix);
  _rows = (SPIRType *)pack_pfx.field_2._8_8_;
  id = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
  bVar2 = Compiler::has_member_decoration((Compiler *)this,(TypeID)id.id,index,DecorationOffset);
  if (bVar2) {
    this->is_using_builtin_array = true;
  }
  else {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    bVar2 = Compiler::has_extended_member_decoration
                      ((Compiler *)this,uVar3,index,SPIRVCrossDecorationResourceIndexPrimary);
    if (bVar2) {
      this->is_using_builtin_array = true;
    }
  }
  bVar2 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  if (bVar2) {
    if (*(int *)(pack_pfx.field_2._8_8_ + 0x10) == 0xf) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Cannot emit a packed struct currently.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = Compiler::is_matrix((Compiler *)this,(SPIRType *)pack_pfx.field_2._8_8_);
    if (bVar2) {
      local_1e0 = *(uint *)(pack_pfx.field_2._8_8_ + 0x18);
      base_type.field_2._12_4_ = *(undefined4 *)(pack_pfx.field_2._8_8_ + 0x1c);
      ::std::__cxx11::string::operator=((string *)local_60,"packed_");
      if (local_75 != false) {
        local_1e0 = *(uint *)(pack_pfx.field_2._8_8_ + 0x1c);
        base_type.field_2._12_4_ = *(undefined4 *)(pack_pfx.field_2._8_8_ + 0x18);
        ::std::__cxx11::string::operator=((string *)local_60,"packed_rm_");
      }
      pcVar1 = "snorm float";
      if (*(int *)(pack_pfx.field_2._8_8_ + 0x14) == 0x10) {
        pcVar1 = "vload_half";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)local_208,pcVar1 + 6,(allocator *)(td_line.field_2._M_local_buf + 0xf));
      ::std::allocator<char>::~allocator((allocator<char> *)(td_line.field_2._M_local_buf + 0xf));
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_230,"typedef ",&local_231);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
      ::std::operator+(&local_278,"packed_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208);
      ::std::__cxx11::to_string(&local_298,local_1e0);
      ::std::operator+(&local_258,&local_278,&local_298);
      ::std::__cxx11::string::operator+=((string *)local_230,(string *)&local_258);
      ::std::__cxx11::string::~string((string *)&local_258);
      ::std::__cxx11::string::~string((string *)&local_298);
      ::std::__cxx11::string::~string((string *)&local_278);
      ::std::operator+(&local_2b8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
      ::std::__cxx11::string::operator+=((string *)local_230,(string *)&local_2b8);
      ::std::__cxx11::string::~string((string *)&local_2b8);
      ::std::__cxx11::to_string(&local_338,*(uint *)(pack_pfx.field_2._8_8_ + 0x1c));
      ::std::operator+(&local_318,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&local_338);
      ::std::operator+(&local_2f8,&local_318,"x");
      ::std::__cxx11::to_string(&local_358,*(uint *)(pack_pfx.field_2._8_8_ + 0x18));
      ::std::operator+(&local_2d8,&local_2f8,&local_358);
      ::std::__cxx11::string::operator+=((string *)local_230,(string *)&local_2d8);
      ::std::__cxx11::string::~string((string *)&local_2d8);
      ::std::__cxx11::string::~string((string *)&local_358);
      ::std::__cxx11::string::~string((string *)&local_2f8);
      ::std::__cxx11::string::~string((string *)&local_318);
      ::std::__cxx11::string::~string((string *)&local_338);
      ::std::__cxx11::to_string(&local_3b8,base_type.field_2._12_4_);
      ::std::operator+(&local_398,"[",&local_3b8);
      ::std::operator+(&local_378,&local_398,"]");
      ::std::__cxx11::string::operator+=((string *)local_230,(string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_398);
      ::std::__cxx11::string::~string((string *)&local_3b8);
      ::std::__cxx11::string::operator+=((string *)local_230,";");
      add_typedef_line(this,(string *)local_230);
      ::std::__cxx11::string::~string((string *)local_230);
      ::std::__cxx11::string::~string((string *)local_208);
    }
    else {
      bVar2 = Compiler::is_scalar((Compiler *)this,(SPIRType *)pack_pfx.field_2._8_8_);
      if (!bVar2) {
        ::std::__cxx11::string::operator=((string *)local_60,"packed_");
      }
    }
  }
  else {
    bVar2 = Compiler::is_matrix((Compiler *)this,(SPIRType *)pack_pfx.field_2._8_8_);
    if (bVar2) {
      bVar2 = Options::supports_msl_version(&this->msl_options,3,0,0);
      if (!bVar2) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        bVar2 = Compiler::has_extended_decoration
                          ((Compiler *)this,uVar3,SPIRVCrossDecorationWorkgroupStruct);
        if (bVar2) {
          ::std::__cxx11::string::operator=((string *)local_60,"spvStorage_");
          add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
          this->is_using_builtin_array = true;
        }
      }
      if (local_75 != false) {
        SPIRType::operator=((SPIRType *)&declared_type,(SPIRType *)pack_pfx.field_2._8_8_);
        ::std::swap<unsigned_int>(&row_major_physical_type.basetype,&row_major_physical_type.width);
        _rows = (SPIRType *)&declared_type;
      }
    }
  }
  local_6ca = 0;
  if ((*(int *)(pack_pfx.field_2._8_8_ + 0x10) == 0x10) &&
     (local_6ca = 0, *(int *)(pack_pfx.field_2._8_8_ + 0x104) == 2)) {
    bVar2 = Options::is_ios(&this->msl_options);
    local_6ca = 0;
    if ((bVar2) && (local_6ca = 0, (int)(this->msl_options).argument_buffers_tier < 1)) {
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)((long)&array_type.field_2 + 0xc),local_64);
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)array_type.field_2._12_4_,DecorationNonWritable);
      local_6ca = bVar2 ^ 0xff;
    }
  }
  if ((local_6ca & 1) != 0) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar5,"Writable images are not allowed on Tier1 argument buffers on iOS.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ::std::__cxx11::string::string((string *)local_3e0);
  if (((*(int *)(pack_pfx.field_2._8_8_ + 0x10) == 0x10) ||
      (*(int *)(pack_pfx.field_2._8_8_ + 0x10) == 0x12)) ||
     (*(int *)(pack_pfx.field_2._8_8_ + 0x10) == 0x11)) goto LAB_004481f0;
  local_3e4 = BuiltInMax;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_out_var_id);
  if (uVar3 == 0) {
LAB_00448089:
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    local_6f9 = false;
    if (uVar3 != 0) {
      pSVar6 = get_stage_in_struct_type(this);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      local_6f9 = false;
      if (uVar3 == uVar4) {
        local_6f9 = variable_storage_requires_stage_io(this,Input);
      }
    }
    local_6f2 = local_6f9;
  }
  else {
    pSVar6 = get_stage_out_struct_type(this);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    if (uVar3 != uVar4) goto LAB_00448089;
    bVar2 = variable_storage_requires_stage_io(this,Output);
    local_6f2 = true;
    if (!bVar2) goto LAB_00448089;
  }
  local_3e5 = local_6f2;
  if ((local_6f2 != false) &&
     (bVar2 = Compiler::is_member_builtin((Compiler *)this,type,index,&local_3e4), bVar2)) {
    this->is_using_builtin_array = true;
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
            (&data_type,this,pack_pfx.field_2._8_8_,(ulong)local_64);
  ::std::__cxx11::string::operator=((string *)local_3e0,(string *)&data_type);
  ::std::__cxx11::string::~string((string *)&data_type);
LAB_004481f0:
  if (local_64 != 0) {
    decl_type.field_2._8_8_ = _rows;
    bVar2 = Compiler::is_pointer((Compiler *)this,_rows);
    if (bVar2) {
      decl_type.field_2._8_8_ = Compiler::get_pointee_type((Compiler *)this,_rows);
    }
    bVar2 = Compiler::is_array((Compiler *)this,(SPIRType *)decl_type.field_2._8_8_);
    if ((bVar2) &&
       (uVar3 = get_resource_array_size(this,(SPIRType *)decl_type.field_2._8_8_,local_64),
       uVar3 == 0)) {
      ::std::__cxx11::string::operator=((string *)local_3e0,"[1] /* unsized array hack */");
    }
  }
  ::std::__cxx11::string::string((string *)&orig_type.member_name_cache._M_h._M_single_bucket);
  if (_rows->vecsize < 5) {
    type_to_glsl_abi_cxx11_((string *)&overlapping_binding_tag,this,_rows,local_64,true);
    ::std::__cxx11::string::operator=
              ((string *)&orig_type.member_name_cache._M_h._M_single_bucket,
               (string *)&overlapping_binding_tag);
    ::std::__cxx11::string::~string((string *)&overlapping_binding_tag);
  }
  else {
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,member_type_id);
    SPIRType::SPIRType((SPIRType *)local_580,pSVar6);
    bVar2 = Compiler::is_matrix((Compiler *)this,(SPIRType *)local_580);
    if ((bVar2) && (local_75 != false)) {
      ::std::swap<unsigned_int>(&orig_type.basetype,&orig_type.width);
    }
    orig_type.width = 1;
    ts_2 = (char (*) [2])0x1;
    type_to_glsl_abi_cxx11_(&local_5a0,this,(SPIRType *)local_580,local_64,true);
    ::std::__cxx11::string::operator=
              ((string *)&orig_type.member_name_cache._M_h._M_single_bucket,(string *)&local_5a0);
    ::std::__cxx11::string::~string((string *)&local_5a0);
    if (_rows->columns < 2) {
      join<char_const(&)[17],std::__cxx11::string&,char_const(&)[2]>
                (&local_5e0,(spirv_cross *)"spvPaddedStd140<",
                 (char (*) [17])&orig_type.member_name_cache._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6747b7,ts_2)
      ;
      ::std::__cxx11::string::operator=
                ((string *)&orig_type.member_name_cache._M_h._M_single_bucket,(string *)&local_5e0);
      ::std::__cxx11::string::~string((string *)&local_5e0);
    }
    else {
      join<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_5c0,(spirv_cross *)"spvPaddedStd140Matrix<",
                 (char (*) [23])&orig_type.member_name_cache._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6737c9,
                 (char (*) [3])&_rows->columns,(uint *)0x6747b7,in_stack_fffffffffffff898);
      ::std::__cxx11::string::operator=
                ((string *)&orig_type.member_name_cache._M_h._M_single_bucket,(string *)&local_5c0);
      ::std::__cxx11::string::~string((string *)&local_5c0);
    }
    SPIRType::~SPIRType((SPIRType *)local_580);
  }
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  bVar2 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,uVar3,index,SPIRVCrossDecorationOverlappingBinding);
  local_608 = "";
  if (bVar2) {
    local_608 = "// Overlapping binding: ";
  }
  local_609 = 0;
  CompilerGLSL::to_member_name_abi_cxx11_(&local_630,&this->super_CompilerGLSL,type,index);
  member_attribute_qualifier_abi_cxx11_(&local_650,this,type,index);
  join<char_const*&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&local_608,(char **)local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &orig_type.member_name_cache._M_h._M_single_bucket,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
             (char (*) [2])qualifier,&local_630,&local_650,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6815db,
             (char (*) [2])qualifier);
  ::std::__cxx11::string::~string((string *)&local_650);
  ::std::__cxx11::string::~string((string *)&local_630);
  this->is_using_builtin_array = false;
  local_609 = 1;
  ::std::__cxx11::string::~string((string *)&orig_type.member_name_cache._M_h._M_single_bucket);
  ::std::__cxx11::string::~string((string *)local_3e0);
  SPIRType::~SPIRType((SPIRType *)&declared_type);
  ::std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	uint32_t orig_member_type_id = member_type_id;
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type { OpTypeMatrix };
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput)));
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type, orig_id);
	}

	if (orig_id)
	{
		auto *data_type = declared_type;
		if (is_pointer(*data_type))
			data_type = &get_pointee_type(*data_type);

		if (is_array(*data_type) && get_resource_array_size(*data_type, orig_id) == 0)
		{
			// Hack for declaring unsized array of resources. Need to declare dummy sized array by value inline.
			// This can then be wrapped in spvDescriptorArray as usual.
			array_type = "[1] /* unsized array hack */";
		}
	}

	string decl_type;
	if (declared_type->vecsize > 4)
	{
		auto orig_type = get<SPIRType>(orig_member_type_id);
		if (is_matrix(orig_type) && row_major)
			swap(orig_type.vecsize, orig_type.columns);
		orig_type.columns = 1;
		decl_type = type_to_glsl(orig_type, orig_id, true);

		if (declared_type->columns > 1)
			decl_type = join("spvPaddedStd140Matrix<", decl_type, ", ", declared_type->columns, ">");
		else
			decl_type = join("spvPaddedStd140<", decl_type, ">");
	}
	else
		decl_type = type_to_glsl(*declared_type, orig_id, true);

	const char *overlapping_binding_tag =
			has_extended_member_decoration(type.self, index, SPIRVCrossDecorationOverlappingBinding) ?
			"// Overlapping binding: " : "";

	auto result = join(overlapping_binding_tag, pack_pfx, decl_type, " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}